

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O3

void Abc_NtkRetimeTranferToCopy(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar2];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8)) {
        *(ulong *)((long)pvVar1 + 0x40) = (ulong)(*(long *)((long)pvVar1 + 0x38) == 2);
        pVVar3 = pNtk->vObjs;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_NtkRetimeTranferToCopy( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_LatchIsInit1(pObj);
}